

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O1

void __thiscall
Eigen::internal::CompressedStorage<float,_int>::resize
          (CompressedStorage<float,_int> *this,Index size,double reserveSizeFactor)

{
  Scalar *pSVar1;
  StorageIndex *pSVar2;
  Scalar *__dest;
  StorageIndex *__dest_00;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  IntPtr size_1;
  
  if (this->m_allocatedSize < size) {
    uVar4 = (long)((double)size * reserveSizeFactor) + size;
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0x7fffffff;
    }
    if ((long)uVar4 < size) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = boost::program_options::detail::cmdline::cmdline;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar5 = -(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4;
    __dest = (Scalar *)operator_new__(uVar5);
    __dest_00 = (StorageIndex *)operator_new__(uVar5);
    uVar5 = this->m_size;
    if ((long)uVar4 <= this->m_size) {
      uVar5 = uVar4;
    }
    if (0 < (long)uVar5) {
      memcpy(__dest,this->m_values,uVar5 << 2);
      memcpy(__dest_00,this->m_indices,uVar5 << 2);
    }
    pSVar1 = this->m_values;
    pSVar2 = this->m_indices;
    this->m_values = __dest;
    this->m_indices = __dest_00;
    this->m_allocatedSize = uVar4;
    if (pSVar2 != (StorageIndex *)0x0) {
      operator_delete__(pSVar2);
    }
    if (pSVar1 != (Scalar *)0x0) {
      operator_delete__(pSVar1);
    }
  }
  this->m_size = size;
  return;
}

Assistant:

void resize(Index size, double reserveSizeFactor = 0)
    {
      if (m_allocatedSize<size)
      {
        Index realloc_size = (std::min<Index>)(NumTraits<StorageIndex>::highest(),  size + Index(reserveSizeFactor*double(size)));
        if(realloc_size<size)
          internal::throw_std_bad_alloc();
        reallocate(realloc_size);
      }
      m_size = size;
    }